

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

void parseFontName(QString *name,QString *foundry,QString *family)

{
  bool bVar1;
  QChar QVar2;
  int iVar3;
  qsizetype qVar4;
  int iVar5;
  QString *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int len;
  QChar *s;
  bool space;
  int li;
  int i;
  undefined4 in_stack_ffffffffffffff58;
  CaseSensitivity in_stack_ffffffffffffff5c;
  uint7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QString *this;
  QString *n;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QChar *local_80;
  QChar in_stack_ffffffffffffff8e;
  ushort uVar6;
  QChar local_2c;
  char16_t local_2a;
  undefined1 local_28 [28];
  QChar local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QChar::QChar<char16_t,_true>(&local_a,L'[');
  qVar4 = QString::indexOf(this,in_stack_ffffffffffffff8e,
                           CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c);
  iVar3 = (int)qVar4;
  n = in_RDI;
  QChar::QChar<char16_t,_true>(&local_c,L']');
  qVar4 = QString::lastIndexOf
                    ((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                     (QChar)(char16_t)((ulong)this >> 0x30),in_stack_ffffffffffffff5c);
  if (((iVar3 < 0) || ((int)qVar4 < 0)) || ((int)qVar4 <= iVar3)) {
    QString::clear((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    QString::operator=(in_RDX,(QString *)in_RDI);
  }
  else {
    QString::mid((longlong)local_28,(longlong)in_RDI);
    QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QString::~QString((QString *)0x741836);
    in_stack_ffffffffffffff67 = false;
    if (0 < iVar3) {
      local_2a = (char16_t)QString::operator[](this,(ulong)in_stack_ffffffffffffff60);
      QChar::QChar<char16_t,_true>(&local_2c,L' ');
      in_stack_ffffffffffffff67 =
           operator==((QChar *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      (QChar *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    QString::left((QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                  (qsizetype)n);
    QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QString::~QString((QString *)0x7418c0);
  }
  uVar6 = 0x100;
  local_80 = QString::data((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
  ;
  qVar4 = QString::size(in_RDX);
  iVar3 = (int)qVar4;
  while (iVar5 = iVar3 + -1, iVar3 != 0) {
    iVar3 = iVar5;
    if ((uVar6 & 0x100) != 0) {
      QVar2 = QChar::toUpper((QChar *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
      ;
      local_80->ucs = QVar2.ucs;
      iVar3 = iVar5;
    }
    bVar1 = QChar::isSpace((QChar *)0x74193c);
    uVar6 = (ushort)bVar1 << 8;
    local_80 = local_80 + 1;
  }
  uVar6 = 0x100;
  local_80 = QString::data((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
  ;
  qVar4 = QString::size(in_RSI);
  iVar3 = (int)qVar4;
  while (iVar5 = iVar3 + -1, iVar3 != 0) {
    iVar3 = iVar5;
    if ((uVar6 & 0x100) != 0) {
      QVar2 = QChar::toUpper((QChar *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
      ;
      local_80->ucs = QVar2.ucs;
      iVar3 = iVar5;
    }
    bVar1 = QChar::isSpace((QChar *)0x7419b3);
    uVar6 = (ushort)bVar1 << 8;
    local_80 = local_80 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parseFontName(const QString &name, QString &foundry, QString &family)
{
    int i = name.indexOf(u'[');
    int li = name.lastIndexOf(u']');
    if (i >= 0 && li >= 0 && i < li) {
        foundry = name.mid(i + 1, li - i - 1);
        if (i > 0 && name[i - 1] == u' ')
            i--;
        family = name.left(i);
    } else {
        foundry.clear();
        family = name;
    }

    // capitalize the family/foundry names
    bool space = true;
    QChar *s = family.data();
    int len = family.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }

    space = true;
    s = foundry.data();
    len = foundry.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }
}